

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall Assimp::FBX::MeshGeometry::~MeshGeometry(MeshGeometry *this)

{
  string *local_50;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_38;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_18;
  MeshGeometry *this_local;
  
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_0037b680;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_mappings);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_mapping_offsets);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_mapping_counts);
  local_18 = (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&this->m_mapping_counts
  ;
  do {
    local_18 = local_18 + -1;
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector(local_18);
  } while (local_18 != this->m_colors);
  local_38 = this->m_colors;
  do {
    local_38 = local_38 + -1;
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~vector
              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_38);
  } while (local_38 != (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)this->m_uvs);
  local_50 = (string *)this->m_uvs;
  do {
    local_50 = local_50 + -0x20;
    std::__cxx11::string::~string(local_50);
  } while (local_50 != (string *)&this->field_0x100);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_normals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_binormals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_tangents);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            (&this->m_facesVertexStartIndices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_faces);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_vertices);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_materials);
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

MeshGeometry::~MeshGeometry() {
    // empty
}